

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall QHybrid::SoftPrintBrief_abi_cxx11_(QHybrid *this)

{
  long *in_RSI;
  
  SoftPrintBrief_abi_cxx11_((string *)this,(QHybrid *)((long)in_RSI + *(long *)(*in_RSI + -0x58)));
  return;
}

Assistant:

string QHybrid::SoftPrintBrief() const
{
    stringstream ss;
    ss << "QHybrid_"
       << SoftPrint(_m_QheurTypeFirstTS)
       << "_";
    if(_m_QlastTimeSteps)
        ss << _m_QlastTimeSteps->SoftPrintBrief();
    else
        ss << "noQlast";
    ss << "_hLT";
    if(_m_optimizedHorLast)
        ss << "0";
    else
        ss <<_m_horizonLastTimeSteps;
    return(ss.str());
}